

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O2

void __thiscall
sentencepiece::ModelProto_SentencePiece::InternalSwap
          (ModelProto_SentencePiece *this,ModelProto_SentencePiece *other)

{
  InternalMetadata *this_00;
  float fVar1;
  uint32 uVar2;
  int iVar3;
  void *pvVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *other_00;
  void *pvVar6;
  bool bVar7;
  
  google::protobuf::internal::ExtensionSet::Swap(&this->_extensions_,&other->_extensions_);
  pvVar6 = (this->super_MessageLite)._internal_metadata_.ptr_;
  pvVar4 = (other->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar6 & 1) == 0) {
    if (((ulong)pvVar4 & 1) == 0) {
      bVar7 = true;
      goto LAB_001bec08;
    }
LAB_001bebea:
    other_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (((ulong)pvVar4 & 0xfffffffffffffffe) + 8);
  }
  else {
    if (((ulong)pvVar4 & 1) != 0) goto LAB_001bebea;
    other_00 = google::protobuf::internal::InternalMetadata::
               mutable_unknown_fields_slow<std::__cxx11::string>
                         (&(other->super_MessageLite)._internal_metadata_);
  }
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  google::protobuf::internal::InternalMetadata::DoSwap<std::__cxx11::string>(this_00,other_00);
  pvVar6 = this_00->ptr_;
  bVar7 = ((ulong)pvVar6 & 1) == 0;
LAB_001bec08:
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  if (!bVar7) {
    pvVar6 = *(void **)((ulong)pvVar6 & 0xfffffffffffffffe);
  }
  if (((undefined8 *)(this->piece_).tagged_ptr_.ptr_ !=
       &google::protobuf::internal::fixed_address_empty_string) ||
     ((undefined8 *)(other->piece_).tagged_ptr_.ptr_ !=
      &google::protobuf::internal::fixed_address_empty_string)) {
    psVar5 = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(&this->piece_,pvVar6);
    google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(&other->piece_,pvVar6);
    std::__cxx11::string::swap((string *)psVar5);
  }
  fVar1 = this->score_;
  this->score_ = other->score_;
  other->score_ = fVar1;
  iVar3 = this->type_;
  this->type_ = other->type_;
  other->type_ = iVar3;
  return;
}

Assistant:

void ModelProto_SentencePiece::InternalSwap(ModelProto_SentencePiece* other) {
  using std::swap;
  _extensions_.Swap(&other->_extensions_);
  _internal_metadata_.Swap<std::string>(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  piece_.Swap(&other->piece_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  swap(score_, other->score_);
  swap(type_, other->type_);
}